

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_ManFree(Kf_Man_t *p)

{
  int *piVar1;
  float *pfVar2;
  word *__ptr;
  word **__ptr_00;
  long lVar3;
  
  piVar1 = p->pGia->pRefs;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    p->pGia->pRefs = (int *)0x0;
  }
  piVar1 = (p->vCuts).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCuts).pArray = (int *)0x0;
  }
  piVar1 = (p->vTime).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTime).pArray = (int *)0x0;
  }
  pfVar2 = (p->vArea).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vArea).pArray = (float *)0x0;
  }
  pfVar2 = (p->vRefs).pArray;
  if (pfVar2 != (float *)0x0) {
    free(pfVar2);
    (p->vRefs).pArray = (float *)0x0;
  }
  if (p->vTemp != (Vec_Int_t *)0x0) {
    piVar1 = p->vTemp->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTemp->pArray = (int *)0x0;
    }
    if (p->vTemp != (Vec_Int_t *)0x0) {
      free(p->vTemp);
      p->vTemp = (Vec_Int_t *)0x0;
    }
  }
  if (0 < (p->pMem).nPagesAlloc) {
    lVar3 = 0;
    do {
      __ptr = (p->pMem).pPages[lVar3];
      if (__ptr != (word *)0x0) {
        free(__ptr);
        (p->pMem).pPages[lVar3] = (word *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->pMem).nPagesAlloc);
  }
  __ptr_00 = (p->pMem).pPages;
  if (__ptr_00 != (word **)0x0) {
    free(__ptr_00);
    (p->pMem).pPages = (word **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Kf_ManFree( Kf_Man_t * p )
{
    ABC_FREE( p->pGia->pRefs );
    ABC_FREE( p->vCuts.pArray );
    ABC_FREE( p->vTime.pArray );
    ABC_FREE( p->vArea.pArray );
    ABC_FREE( p->vRefs.pArray );
    Vec_IntFreeP( &p->vTemp );
    Vec_SetFree_( &p->pMem );
    ABC_FREE( p );
}